

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_source_token_maybe_relative(Context_conflict2 *ctx,int relok)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined3 uVar6;
  int iVar7;
  Token TVar8;
  int iVar9;
  int iVar10;
  SourceMod negated;
  SourceMod norm;
  size_t __n;
  char *reason;
  uint uVar11;
  uint32 *__dest;
  long lVar12;
  uint uVar13;
  SourceMod srcmod;
  uint32 ui32;
  undefined1 local_4c;
  int regnum;
  RegisterType regtype;
  ulong local_40;
  long local_38;
  
  iVar7 = tokenbuf_overflow(ctx);
  if (iVar7 != 0) {
    return 0;
  }
  lVar12 = (long)ctx->tokenbufpos;
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[lVar12] = 0;
  srcmod = SRCMOD_NONE;
  TVar8 = nexttoken(ctx);
  if (TVar8 == TOKEN_INT_LITERAL) {
    iVar7 = check_token(ctx,"1");
    if (iVar7 == 0) {
LAB_001382e9:
      pushback(ctx);
    }
    else {
      TVar8 = nexttoken(ctx);
      if (TVar8 == 0x2d) {
        srcmod = SRCMOD_COMPLEMENT;
        goto LAB_001382df;
      }
      fail(ctx,"Unexpected token");
    }
    iVar7 = 0;
    bVar3 = true;
    bVar2 = true;
  }
  else if (TVar8 == 0x2d) {
    iVar7 = 1;
    bVar3 = true;
    bVar2 = false;
  }
  else {
    if (TVar8 != 0x21) goto LAB_001382e9;
    srcmod = SRCMOD_NOT;
LAB_001382df:
    bVar3 = false;
    bVar2 = true;
    iVar7 = 0;
  }
  parse_register_name(ctx,&regtype,&regnum);
  if (ctx->tokenlen == 0) {
    if (!bVar2) {
      if (bVar3) {
        srcmod = SRCMOD_NEGATE;
      }
      else {
        reason = "Incompatible source modifiers";
LAB_00138360:
        fail(ctx,reason);
      }
    }
  }
  else {
    iVar9 = check_token_segment(ctx,"_bias");
    if (iVar9 == 0) {
      iVar9 = check_token_segment(ctx,"_bx2");
      if (iVar9 == 0) {
        iVar9 = check_token_segment(ctx,"_x2");
        if (iVar9 == 0) {
          iVar9 = check_token_segment(ctx,"_dz");
          if ((iVar9 == 0) && (iVar9 = check_token_segment(ctx,"_db"), iVar9 == 0)) {
            iVar9 = check_token_segment(ctx,"_dw");
            if ((iVar9 == 0) && (iVar9 = check_token_segment(ctx,"_da"), iVar9 == 0)) {
              iVar9 = check_token_segment(ctx,"_abs");
              if (iVar9 == 0) {
                reason = "Invalid source modifier";
                goto LAB_00138360;
              }
              norm = SRCMOD_ABS;
              negated = SRCMOD_ABSNEGATE;
              goto LAB_00138391;
            }
            norm = SRCMOD_DW;
          }
          else {
            norm = SRCMOD_DZ;
          }
          negated = SRCMOD_NONE;
        }
        else {
          norm = SRCMOD_X2;
          negated = SRCMOD_X2NEGATE;
        }
      }
      else {
        norm = SRCMOD_SIGN;
        negated = SRCMOD_SIGNNEGATE;
      }
    }
    else {
      norm = SRCMOD_BIAS;
      negated = SRCMOD_BIASNEGATE;
    }
LAB_00138391:
    set_source_mod(ctx,iVar7,norm,negated,&srcmod);
  }
  TVar8 = nexttoken(ctx);
  local_38 = lVar12;
  if (TVar8 == 0x5b) {
    if (relok == 0) {
      fail(ctx,"Relative addressing not permitted here.");
      iVar7 = 1;
    }
    else {
      iVar7 = 2;
    }
    parse_source_token_maybe_relative(ctx,0);
    TVar8 = nexttoken(ctx);
    if (TVar8 == 0x2b) {
      if (regnum != 0) {
        fail(ctx,"Relative addressing with explicit register number.");
      }
      ui32 = 0;
      TVar8 = nexttoken(ctx);
      if (((TVar8 != TOKEN_INT_LITERAL) || (iVar9 = ui32fromtoken(ctx,&ui32), iVar9 == 0)) ||
         (ctx->tokenlen != 0)) {
        fail(ctx,"Invalid relative addressing offset");
      }
      regnum = regnum + ui32;
    }
    else {
      pushback(ctx);
    }
    TVar8 = nexttoken(ctx);
    iVar9 = 0x2000;
    if (TVar8 != 0x5d) {
      fail(ctx,"Expected \']\'");
    }
  }
  else {
    pushback(ctx);
    iVar7 = 1;
    iVar9 = 0;
  }
  TVar8 = nexttoken(ctx);
  uVar13 = regnum;
  if (TVar8 == 0x2e) {
    iVar10 = scalar_register(ctx->shader_type,regtype,regnum);
    if (iVar10 == 0) {
      TVar8 = nexttoken(ctx);
      iVar10 = 0;
      if (TVar8 == TOKEN_IDENTIFIER) {
        __dest = &ui32;
        local_4c = 0;
        ui32 = 0;
        uVar11 = ctx->tokenlen;
        local_40 = (ulong)uVar11;
        __n = 4;
        if (uVar11 < 4) {
          __n = (size_t)uVar11;
        }
        memcpy(__dest,ctx->token,__n);
        uVar6 = (undefined3)ui32;
        uVar5 = (undefined2)ui32;
        bVar2 = false;
        switch((int)local_40) {
        case 1:
          uVar4 = (undefined1)ui32;
          ui32._0_3_ = CONCAT12((undefined1)ui32,uVar5);
          ui32 = CONCAT13(uVar4,(undefined3)ui32);
          ui32._0_2_ = CONCAT11(uVar4,uVar4);
          bVar2 = false;
          break;
        case 2:
          uVar4 = ui32._1_1_;
          ui32._0_3_ = CONCAT12(ui32._1_1_,uVar5);
          ui32 = CONCAT13(uVar4,(undefined3)ui32);
          bVar2 = false;
          break;
        case 3:
          ui32 = CONCAT13(ui32._2_1_,uVar6);
          break;
        case 4:
          break;
        default:
          bVar2 = true;
        }
        local_4c = 0;
        uVar11 = 0;
        iVar10 = 0;
        for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 2) {
          cVar1 = (char)*__dest;
          switch(cVar1) {
          case 'r':
          case 'x':
            iVar10 = 0;
            break;
          case 'w':
switchD_001385ec_caseD_77:
            iVar10 = 3;
            break;
          case 'y':
switchD_001385ec_caseD_79:
            iVar10 = 1;
            break;
          case 'z':
switchD_001385ec_caseD_7a:
            iVar10 = 2;
            break;
          default:
            if (cVar1 == 'a') goto switchD_001385ec_caseD_77;
            if (cVar1 == 'b') goto switchD_001385ec_caseD_7a;
            if (cVar1 == 'g') goto switchD_001385ec_caseD_79;
          case 's':
          case 't':
          case 'u':
          case 'v':
            bVar2 = true;
          }
          uVar11 = uVar11 | iVar10 << ((byte)lVar12 & 0x1f);
          __dest = (uint32 *)((long)__dest + 1);
        }
        iVar10 = (uVar11 & 0xff) << 0x10;
        if (!bVar2) goto LAB_00138643;
      }
      fail(ctx,"Invalid swizzle");
    }
    else {
      fail(ctx,"Swizzle specified for scalar register");
      iVar10 = 0;
    }
  }
  else {
    pushback(ctx);
    iVar10 = 0xe40000;
    uVar13 = regnum;
  }
LAB_00138643:
  ctx->tokenbuf[local_38] =
       (regtype & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT)) << 8 |
       regtype * 0x10000000 + iVar9 + (uVar13 & 0x7ff) + iVar10 +
       (srcmod & (SRCMOD_TOTAL|SRCMOD_NEGATE)) * 0x1000000 | 0x80000000;
  return iVar7;
}

Assistant:

static int parse_source_token_maybe_relative(Context *ctx, const int relok)
{
    int retval = 1;

    if (tokenbuf_overflow(ctx))
        return 0;

    // mark this now, so optional relative addressing token is placed second.
    uint32 *outtoken = &ctx->tokenbuf[ctx->tokenbufpos++];
    *outtoken = 0;

    SourceMod srcmod = SRCMOD_NONE;
    int negate = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '!'))
        srcmod = SRCMOD_NOT;
    else if (token == ((Token) '-'))
        negate = 1;
    else if ( (token == TOKEN_INT_LITERAL) && (check_token(ctx, "1")) )
    {
        if (nexttoken(ctx) != ((Token) '-'))
            fail(ctx, "Unexpected token");
        else
            srcmod = SRCMOD_COMPLEMENT;
    } // else
    else
    {
        pushback(ctx);
    } // else

    RegisterType regtype;
    int regnum;
    parse_register_name(ctx, &regtype, &regnum);

    if (ctx->tokenlen == 0)
    {
        if (negate)
            set_source_mod(ctx, negate, SRCMOD_NONE, SRCMOD_NEGATE, &srcmod);
    } // if
    else
    {
        assert(ctx->tokenlen > 0);
        if (check_token_segment(ctx, "_bias"))
            set_source_mod(ctx, negate, SRCMOD_BIAS, SRCMOD_BIASNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_bx2"))
            set_source_mod(ctx, negate, SRCMOD_SIGN, SRCMOD_SIGNNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_x2"))
            set_source_mod(ctx, negate, SRCMOD_X2, SRCMOD_X2NEGATE, &srcmod);
        else if (check_token_segment(ctx, "_dz"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_db"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_dw"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_da"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_abs"))
            set_source_mod(ctx, negate, SRCMOD_ABS, SRCMOD_ABSNEGATE, &srcmod);
        else
            fail(ctx, "Invalid source modifier");
    } // else

    uint32 relative = 0;
    if (nexttoken(ctx) != ((Token) '['))
        pushback(ctx);  // not relative addressing?
    else
    {
        if (!relok)
            fail(ctx, "Relative addressing not permitted here.");
        else
            retval++;

        parse_source_token_maybe_relative(ctx, 0);
        relative = 1;

        if (nexttoken(ctx) != ((Token) '+'))
            pushback(ctx);
        else
        {
            // !!! FIXME: maybe c3[a0.x + 5] is legal and becomes c[a0.x + 8] ?
            if (regnum != 0)
                fail(ctx, "Relative addressing with explicit register number.");

            uint32 ui32 = 0;
            if ( (nexttoken(ctx) != TOKEN_INT_LITERAL) ||
                 (!ui32fromtoken(ctx, &ui32)) ||
                 (ctx->tokenlen != 0) )
            {
                fail(ctx, "Invalid relative addressing offset");
            } // if
            regnum += (int) ui32;
        } // else

        if (nexttoken(ctx) != ((Token) ']'))
            fail(ctx, "Expected ']'");
    } // else

    int invalid_swizzle = 0;
    uint32 swizzle = 0;
    if (nexttoken(ctx) != ((Token) '.'))
    {
        swizzle = 0xE4;  // 0xE4 == 11100100 ... 0 1 2 3. No swizzle.
        pushback(ctx);  // no explicit writemask; do full mask.
    } // if
    else if (scalar_register(ctx->shader_type, regtype, regnum))
        fail(ctx, "Swizzle specified for scalar register");
    else if (nexttoken(ctx) != TOKEN_IDENTIFIER)
        invalid_swizzle = 1;
    else
    {
        char tokenbytes[5] = { '\0', '\0', '\0', '\0', '\0' };
        const unsigned int tokenlen = ctx->tokenlen;
        memcpy(tokenbytes, ctx->token, ((tokenlen < 4) ? tokenlen : 4));

        // deal with shortened form (.x = .xxxx, etc).
        if (tokenlen == 1)
            tokenbytes[1] = tokenbytes[2] = tokenbytes[3] = tokenbytes[0];
        else if (tokenlen == 2)
            tokenbytes[2] = tokenbytes[3] = tokenbytes[1];
        else if (tokenlen == 3)
            tokenbytes[3] = tokenbytes[2];
        else if (tokenlen != 4)
            invalid_swizzle = 1;
        tokenbytes[4] = '\0';

        uint32 val = 0;
        int i;
        for (i = 0; i < 4; i++)
        {
            const int component = (int) tokenbytes[i];
            switch (component)
            {
                case 'r': case 'x': val = 0; break;
                case 'g': case 'y': val = 1; break;
                case 'b': case 'z': val = 2; break;
                case 'a': case 'w': val = 3; break;
                default: invalid_swizzle = 1; break;
            } // switch
            swizzle |= (val << (i * 2));
        } // for
    } // else

    if (invalid_swizzle)
        fail(ctx, "Invalid swizzle");

    *outtoken = ( ((((uint32) 1)) << 31) |
                  ((((uint32) regnum) & 0x7ff) << 0) |
                  ((((uint32) relative) & 0x1) << 13) |
                  ((((uint32) swizzle) & 0xFF) << 16) |
                  ((((uint32) srcmod) & 0xF) << 24) |
                  ((((uint32) regtype) & 0x7) << 28) |
                  ((((uint32) regtype) & 0x18) << 8) );

    return retval;
}